

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_decoder.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  StlEncoder *this;
  EncodedGeometryType *pEVar5;
  int64_t iVar6;
  long lVar7;
  pointer in_RSI;
  int in_EDI;
  Status s;
  StlEncoder stl_encoder;
  PlyEncoder ply_encoder;
  ObjEncoder obj_encoder;
  string extension;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> statusor_1;
  Decoder decoder_1;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> in_mesh;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> statusor;
  Decoder decoder;
  EncodedGeometryType geom_type;
  StatusOr<draco::EncodedGeometryType> type_statusor;
  Mesh *mesh;
  unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> pc;
  CycleTimer timer;
  DecoderBuffer buffer;
  vector<char,_std::allocator<char>_> data;
  int i;
  int argc_check;
  Options options;
  Mesh *in_stack_fffffffffffffb08;
  ObjEncoder *in_stack_fffffffffffffb10;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *in_stack_fffffffffffffb18;
  Code in_stack_fffffffffffffb20;
  undefined2 in_stack_fffffffffffffb24;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  string *in_stack_fffffffffffffb28;
  undefined5 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb35;
  undefined1 in_stack_fffffffffffffb36;
  undefined1 in_stack_fffffffffffffb37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  string *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  ObjEncoder *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffbb8;
  Mesh *mesh_00;
  undefined8 in_stack_fffffffffffffbf8;
  StlEncoder local_3f8;
  PlyEncoder local_3e0 [6];
  DecoderBuffer *in_stack_fffffffffffffcb0;
  Decoder *in_stack_fffffffffffffcb8;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
  local_268 [3];
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> local_1c0 [3];
  EncodedGeometryType local_11c;
  StatusOr<draco::EncodedGeometryType> local_118;
  pointer local_e8;
  DracoTimer local_d8 [2];
  undefined1 local_80 [80];
  string local_30 [32];
  pointer local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  anon_unknown.dwarf_7c4b::Options::Options((Options *)in_stack_fffffffffffffb10);
  local_80._44_4_ = local_8 + -1;
  for (local_80._40_4_ = 1; (int)local_80._40_4_ < local_8; local_80._40_4_ = local_80._40_4_ + 1) {
    iVar3 = strcmp("-h",*(char **)(local_10 + (long)(int)local_80._40_4_ * 2));
    if ((iVar3 == 0) ||
       (iVar3 = strcmp("-?",*(char **)(local_10 + (long)(int)local_80._40_4_ * 2)), iVar3 == 0)) {
      anon_unknown.dwarf_7c4b::Usage();
      local_4 = 0;
      local_80._24_4_ = 1;
      goto LAB_0010d225;
    }
    iVar3 = strcmp("-i",*(char **)(local_10 + (long)(int)local_80._40_4_ * 2));
    if ((iVar3 == 0) && ((int)local_80._40_4_ < (int)local_80._44_4_)) {
      lVar7 = (long)(int)local_80._40_4_;
      local_80._40_4_ = local_80._40_4_ + 1;
      std::__cxx11::string::operator=
                ((string *)(local_80 + 0x30),*(char **)(local_10 + lVar7 * 2 + 2));
    }
    else {
      iVar3 = strcmp("-o",*(char **)(local_10 + (long)(int)local_80._40_4_ * 2));
      if ((iVar3 == 0) && ((int)local_80._40_4_ < (int)local_80._44_4_)) {
        lVar7 = (long)(int)local_80._40_4_;
        local_80._40_4_ = local_80._40_4_ + 1;
        std::__cxx11::string::operator=(local_30,*(char **)(local_10 + lVar7 * 2 + 2));
      }
    }
  }
  if ((local_8 < 3) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
    anon_unknown.dwarf_7c4b::Usage();
    local_4 = -1;
    local_80._24_4_ = 1;
    goto LAB_0010d225;
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10c68f);
  bVar1 = draco::ReadFileToBuffer
                    (in_stack_fffffffffffffb28,
                     (vector<char,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb27,
                              CONCAT16(in_stack_fffffffffffffb26,
                                       CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)
                                      )));
  if (bVar1) {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT24(in_stack_fffffffffffffb24,
                                                  in_stack_fffffffffffffb20))));
    if (bVar1) {
      printf("Empty input file.\n");
      local_4 = -1;
      local_80._24_4_ = 1;
    }
    else {
      draco::DecoderBuffer::DecoderBuffer((DecoderBuffer *)in_stack_fffffffffffffb10);
      mesh_00 = (Mesh *)local_80;
      this = (StlEncoder *)
             std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x10c760);
      std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)mesh_00)
      ;
      draco::DecoderBuffer::Init
                ((DecoderBuffer *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                 0x10c78d);
      draco::DracoTimer::DracoTimer(local_d8);
      std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::
      unique_ptr<std::default_delete<draco::PointCloud>,void>
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffb10);
      local_e8 = (pointer)0x0;
      draco::Decoder::GetEncodedGeometryType((DecoderBuffer *)in_stack_fffffffffffffbf8);
      uVar2 = draco::StatusOr<draco::EncodedGeometryType>::ok
                        ((StatusOr<draco::EncodedGeometryType> *)0x10c7db);
      if ((bool)uVar2) {
        pEVar5 = draco::StatusOr<draco::EncodedGeometryType>::value(&local_118);
        local_11c = *pEVar5;
        if (local_11c == TRIANGULAR_MESH) {
          draco::DracoTimer::Start((DracoTimer *)0x10c8ce);
          draco::Decoder::Decoder((Decoder *)in_stack_fffffffffffffb10);
          draco::Decoder::DecodeMeshFromBuffer
                    ((Decoder *)in_stack_fffffffffffffb88,
                     (DecoderBuffer *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
          ;
          bVar1 = draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
                  ::ok((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )0x10c911);
          if (bVar1) {
            in_stack_fffffffffffffb78 =
                 (string *)
                 draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
                 value(local_1c0);
            std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::unique_ptr
                      ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       in_stack_fffffffffffffb10,
                       (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       in_stack_fffffffffffffb08);
            draco::DracoTimer::Stop((DracoTimer *)0x10c9d1);
            bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                               0x10c9e0);
            if (bVar1) {
              local_e8 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
                                   ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                                    in_stack_fffffffffffffb10);
              std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::operator=
                        ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         CONCAT17(in_stack_fffffffffffffb27,
                                  CONCAT16(in_stack_fffffffffffffb26,
                                           CONCAT24(in_stack_fffffffffffffb24,
                                                    in_stack_fffffffffffffb20))),
                         in_stack_fffffffffffffb18);
            }
            std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
                      ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       in_stack_fffffffffffffb10);
            local_80._24_4_ = 0;
          }
          else {
            in_stack_fffffffffffffb88 =
                 (ObjEncoder *)
                 draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
                 status(local_1c0);
            in_stack_fffffffffffffb84 = anon_unknown.dwarf_7c4b::ReturnError((Status *)0x10c94b);
            local_80._24_4_ = 1;
            local_4 = in_stack_fffffffffffffb84;
          }
          draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
          ~StatusOr((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                    in_stack_fffffffffffffb10);
          draco::Decoder::~Decoder((Decoder *)in_stack_fffffffffffffb10);
joined_r0x0010cbdf:
          if (local_80._24_4_ != 0) goto LAB_0010d19b;
        }
        else if (local_11c == POINT_CLOUD) {
          draco::DracoTimer::Start((DracoTimer *)0x10cab7);
          draco::Decoder::Decoder((Decoder *)in_stack_fffffffffffffb10);
          draco::Decoder::DecodePointCloudFromBuffer
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
          bVar1 = draco::
                  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  ::ok((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                        *)0x10caf4);
          if (bVar1) {
            draco::
            StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
            value(local_268);
            std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator=
                      ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffb10,
                       (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffb08);
            draco::DracoTimer::Stop((DracoTimer *)0x10cbaf);
          }
          else {
            draco::
            StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
            status(local_268);
            in_stack_fffffffffffffb5c = anon_unknown.dwarf_7c4b::ReturnError((Status *)0x10cb22);
            local_4 = in_stack_fffffffffffffb5c;
          }
          local_80._25_3_ = 0;
          local_80[0x18] = !bVar1;
          draco::
          StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
          ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                     *)in_stack_fffffffffffffb10);
          draco::Decoder::~Decoder((Decoder *)in_stack_fffffffffffffb10);
          goto joined_r0x0010cbdf;
        }
        bVar1 = std::operator==((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                 *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        if (bVar1) {
          printf("Failed to decode the input file.\n");
          local_4 = -1;
          local_80._24_4_ = 1;
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) != 0) {
            std::operator+(in_stack_fffffffffffffb38,
                           (char *)CONCAT17(in_stack_fffffffffffffb37,
                                            CONCAT16(in_stack_fffffffffffffb36,
                                                     CONCAT15(in_stack_fffffffffffffb35,
                                                              in_stack_fffffffffffffb30))));
            std::__cxx11::string::operator=(local_30,local_288);
            std::__cxx11::string::~string(local_288);
          }
          uVar4 = std::__cxx11::string::size();
          if (uVar4 < 4) {
            std::__cxx11::string::string(local_2c8,local_30);
          }
          else {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_30);
          }
          draco::parser::ToLower
                    ((string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          std::__cxx11::string::~string(local_2c8);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
          if (bVar1) {
            draco::ObjEncoder::ObjEncoder(in_stack_fffffffffffffb10);
            if (local_e8 == (pointer)0x0) {
              std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator*
                        ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         in_stack_fffffffffffffb10);
              bVar1 = draco::ObjEncoder::EncodeToFile
                                (in_stack_fffffffffffffb88,
                                 (PointCloud *)
                                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                 in_stack_fffffffffffffb78);
              if (bVar1) goto LAB_0010ce94;
              printf("Failed to store the decoded point cloud as OBJ.\n");
              local_4 = -1;
              local_80._24_4_ = 1;
            }
            else {
              bVar1 = draco::ObjEncoder::EncodeToFile
                                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                                 (string *)0x10cd86);
              if (bVar1) {
LAB_0010ce94:
                local_80._24_4_ = 0;
              }
              else {
                printf("Failed to store the decoded mesh as OBJ.\n");
                local_4 = -1;
                local_80._24_4_ = 1;
              }
            }
            draco::ObjEncoder::~ObjEncoder(in_stack_fffffffffffffb10);
joined_r0x0010ceb5:
            if (local_80._24_4_ == 0) {
LAB_0010d127:
              in_stack_fffffffffffffb10 = (ObjEncoder *)std::__cxx11::string::c_str();
              iVar6 = draco::DracoTimer::GetInMs(local_d8);
              printf("Decoded geometry saved to %s (%ld ms to decode)\n",in_stack_fffffffffffffb10,
                     iVar6);
              local_4 = 0;
              local_80._24_4_ = 1;
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
            if (bVar1) {
              draco::PlyEncoder::PlyEncoder(local_3e0);
              if (local_e8 == (pointer)0x0) {
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator*((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                          in_stack_fffffffffffffb10);
                in_stack_fffffffffffffb27 =
                     draco::PlyEncoder::EncodeToFile
                               ((PlyEncoder *)in_stack_fffffffffffffb88,
                                (PointCloud *)
                                CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                in_stack_fffffffffffffb78);
                if ((bool)in_stack_fffffffffffffb27) goto LAB_0010d127;
                printf("Failed to store the decoded point cloud as PLY.\n");
                local_4 = -1;
                local_80._24_4_ = 1;
              }
              else {
                bVar1 = draco::PlyEncoder::EncodeToFile
                                  ((PlyEncoder *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
                                   ,(string *)0x10cf20);
                if (bVar1) goto LAB_0010d127;
                printf("Failed to store the decoded mesh as PLY.\n");
                local_4 = -1;
                local_80._24_4_ = 1;
              }
            }
            else {
              in_stack_fffffffffffffb26 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
              if ((bool)in_stack_fffffffffffffb26) {
                draco::StlEncoder::StlEncoder(&local_3f8);
                if (local_e8 != (pointer)0x0) {
                  draco::StlEncoder::EncodeToFile
                            (this,mesh_00,(string *)CONCAT17(uVar2,in_stack_fffffffffffffbb8));
                  in_stack_fffffffffffffb20 =
                       draco::Status::code((Status *)&stack0xfffffffffffffbe0);
                  bVar1 = in_stack_fffffffffffffb20 != OK;
                  if (bVar1) {
                    printf("Failed to store the decoded mesh as STL.\n");
                    local_4 = -1;
                  }
                  local_80._25_3_ = 0;
                  local_80[0x18] = bVar1;
                  draco::Status::~Status((Status *)0x10d0bb);
                  goto joined_r0x0010ceb5;
                }
                printf("Can\'t store a point cloud as STL.\n");
                local_4 = -1;
                local_80._24_4_ = 1;
              }
              else {
                printf("Invalid output file extension. Use .obj .ply or .stl.\n");
                local_4 = -1;
                local_80._24_4_ = 1;
              }
            }
          }
          std::__cxx11::string::~string(local_2a8);
        }
      }
      else {
        draco::StatusOr<draco::EncodedGeometryType>::status(&local_118);
        local_4 = anon_unknown.dwarf_7c4b::ReturnError((Status *)0x10c819);
        local_80._24_4_ = 1;
      }
LAB_0010d19b:
      draco::StatusOr<draco::EncodedGeometryType>::~StatusOr
                ((StatusOr<draco::EncodedGeometryType> *)0x10d1a8);
      std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::~unique_ptr
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffb10);
      draco::DracoTimer::~DracoTimer(local_d8);
      draco::DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x10d1cf);
    }
  }
  else {
    printf("Failed opening the input file.\n");
    local_4 = -1;
    local_80._24_4_ = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb27,
                      CONCAT16(in_stack_fffffffffffffb26,
                               CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))));
LAB_0010d225:
  anon_unknown.dwarf_7c4b::Options::~Options((Options *)in_stack_fffffffffffffb10);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::vector<char> data;
  if (!draco::ReadFileToBuffer(options.input, &data)) {
    printf("Failed opening the input file.\n");
    return -1;
  }

  if (data.empty()) {
    printf("Empty input file.\n");
    return -1;
  }

  // Create a draco decoding buffer. Note that no data is copied in this step.
  draco::DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());

  draco::CycleTimer timer;
  // Decode the input data into a geometry.
  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  auto type_statusor = draco::Decoder::GetEncodedGeometryType(&buffer);
  if (!type_statusor.ok()) {
    return ReturnError(type_statusor.status());
  }
  const draco::EncodedGeometryType geom_type = type_statusor.value();
  if (geom_type == draco::TRIANGULAR_MESH) {
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    std::unique_ptr<draco::Mesh> in_mesh = std::move(statusor).value();
    timer.Stop();
    if (in_mesh) {
      mesh = in_mesh.get();
      pc = std::move(in_mesh);
    }
  } else if (geom_type == draco::POINT_CLOUD) {
    // Failed to decode it as mesh, so let's try to decode it as a point cloud.
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodePointCloudFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    pc = std::move(statusor).value();
    timer.Stop();
  }

  if (pc == nullptr) {
    printf("Failed to decode the input file.\n");
    return -1;
  }

  if (options.output.empty()) {
    // Save the output model into a ply file.
    options.output = options.input + ".ply";
  }

  // Save the decoded geometry into a file.
  const std::string extension = draco::parser::ToLower(
      options.output.size() >= 4
          ? options.output.substr(options.output.size() - 4)
          : options.output);

  if (extension == ".obj") {
    draco::ObjEncoder obj_encoder;
    if (mesh) {
      if (!obj_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as OBJ.\n");
        return -1;
      }
    } else {
      if (!obj_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as OBJ.\n");
        return -1;
      }
    }
  } else if (extension == ".ply") {
    draco::PlyEncoder ply_encoder;
    if (mesh) {
      if (!ply_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as PLY.\n");
        return -1;
      }
    } else {
      if (!ply_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as PLY.\n");
        return -1;
      }
    }
  } else if (extension == ".stl") {
    draco::StlEncoder stl_encoder;
    if (mesh) {
      draco::Status s = stl_encoder.EncodeToFile(*mesh, options.output);
      if (s.code() != draco::Status::OK) {
        printf("Failed to store the decoded mesh as STL.\n");
        return -1;
      }
    } else {
      printf("Can't store a point cloud as STL.\n");
      return -1;
    }
  } else {
    printf("Invalid output file extension. Use .obj .ply or .stl.\n");
    return -1;
  }
  printf("Decoded geometry saved to %s (%" PRId64 " ms to decode)\n",
         options.output.c_str(), timer.GetInMs());
  return 0;
}